

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

ChArchiveOut * __thiscall
chrono::ChArchiveOut::operator<<(ChArchiveOut *this,ChNameValue<myEmployee> *bVal)

{
  ChNameValue<myEmployee> local_30;
  ChNameValue<myEmployee> *local_18;
  ChNameValue<myEmployee> *bVal_local;
  ChArchiveOut *this_local;
  
  local_18 = bVal;
  bVal_local = (ChNameValue<myEmployee> *)this;
  ChNameValue<myEmployee>::ChNameValue(&local_30,bVal);
  out<myEmployee>(this,&local_30);
  ChNameValue<myEmployee>::~ChNameValue(&local_30);
  return this;
}

Assistant:

ChArchiveOut& operator<<(ChNameValue<T> bVal) {
          this->out(bVal);
          return (*this);
      }